

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.c
# Opt level: O2

int chain_segment_mix(mixed_segment *segment)

{
  long *plVar1;
  code *pcVar2;
  int iVar3;
  ulong uVar4;
  uint32_t i;
  ulong uVar5;
  
  plVar1 = (long *)segment->data;
  uVar4 = (ulong)*(uint *)(plVar1 + 1);
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pcVar2 = *(code **)(*(long *)(*plVar1 + uVar5 * 8) + 0x18);
    if (pcVar2 != (code *)0x0) {
      iVar3 = (*pcVar2)();
      if (iVar3 == 0) break;
    }
  }
  return (int)(uVar4 <= uVar5);
}

Assistant:

int chain_segment_mix(struct mixed_segment *segment){
  struct vector *data = (struct vector *)segment->data;
  uint32_t count = data->count;
  for(uint32_t i=0; i<count; ++i){
    struct mixed_segment *segment = (struct mixed_segment *)data->data[i];
    if(segment->mix){
      if(!segment->mix(segment)){
        return 0;
      }
    }
  }
  return 1;
}